

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O1

uint __thiscall
fmt::v5::
basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
::parse_header(basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
               *this,iterator *it,format_specs *spec)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  type tVar3;
  int iVar4;
  wchar_t *pwVar5;
  wchar_t wVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  iterator it_00;
  error_handler eh;
  printf_width_handler<wchar_t> local_50;
  format_arg local_48;
  
  pwVar1 = it->ptr_;
  pwVar2 = it->end_;
  if (pwVar1 == pwVar2) {
    wVar6 = L'\0';
  }
  else {
    wVar6 = *pwVar1;
  }
  uVar7 = 0xffffffff;
  if ((uint)(wVar6 + L'\xffffffd0') < 10) {
    if ((pwVar1 == pwVar2) || (*pwVar1 != L'0')) {
      uVar7 = 0;
      do {
        pwVar5 = pwVar1 + 1;
        if (pwVar1 == pwVar2) {
          iVar4 = -0x30;
        }
        else {
          iVar4 = *pwVar1 + L'\xffffffd0';
        }
        uVar7 = uVar7 * 10 + iVar4;
        if ((pwVar5 == pwVar2) || (9 < (uint)(*pwVar5 + L'\xffffffd0'))) goto LAB_0013f240;
        pwVar1 = pwVar5;
      } while (uVar7 < 0xccccccd);
      uVar7 = 0x80000000;
LAB_0013f240:
      it->ptr_ = pwVar5;
      if ((int)uVar7 < 0) {
        internal::error_handler::on_error((error_handler *)&local_48,"number is too big");
      }
    }
    else {
      it->ptr_ = pwVar1 + 1;
      uVar7 = 0;
    }
    pwVar1 = it->ptr_;
    if ((pwVar1 == it->end_) || (*pwVar1 != L'$')) {
      if (wVar6 == L'0') {
        (spec->super_align_spec).fill_ = L'0';
      }
      bVar9 = uVar7 == 0;
      if (!bVar9) {
        (spec->super_align_spec).width_ = uVar7;
      }
      uVar7 = 0xffffffff;
    }
    else {
      it->ptr_ = pwVar1 + 1;
      bVar9 = true;
    }
    if (!bVar9) {
      return 0xffffffff;
    }
  }
  parse_flags(this,spec,it);
  pwVar1 = it->ptr_;
  pwVar2 = it->end_;
  if (pwVar1 == pwVar2) {
    return uVar7;
  }
  if (*pwVar1 < L'0') {
LAB_0013f2e6:
    if ((pwVar1 != pwVar2) && (*pwVar1 == L'*')) {
      it_00.ptr_ = pwVar1 + 1;
      it->ptr_ = it_00.ptr_;
      it_00.end_ = pwVar2;
      local_50.spec_ = spec;
      get_arg(&local_48,this,it_00,0xffffffff);
      tVar3 = visit_format_arg<fmt::v5::internal::printf_width_handler<wchar_t>,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>>>
                        (&local_50,&local_48);
      (spec->super_align_spec).width_ = tVar3;
    }
  }
  else {
    if (pwVar1 == pwVar2) {
LAB_0013f32c:
      uVar8 = 0;
      do {
        pwVar5 = pwVar1 + 1;
        if (pwVar1 == pwVar2) {
          iVar4 = -0x30;
        }
        else {
          iVar4 = *pwVar1 + L'\xffffffd0';
        }
        uVar8 = uVar8 * 10 + iVar4;
        if ((pwVar5 == pwVar2) || (9 < (uint)(*pwVar5 + L'\xffffffd0'))) goto LAB_0013f377;
        pwVar1 = pwVar5;
      } while (uVar8 < 0xccccccd);
      uVar8 = 0x80000000;
LAB_0013f377:
      it->ptr_ = pwVar5;
      if ((int)uVar8 < 0) {
        internal::error_handler::on_error((error_handler *)&local_48,"number is too big");
      }
    }
    else {
      if (L'9' < *pwVar1) goto LAB_0013f2e6;
      if ((pwVar1 == pwVar2) || (*pwVar1 != L'0')) goto LAB_0013f32c;
      it->ptr_ = pwVar1 + 1;
      uVar8 = 0;
    }
    (spec->super_align_spec).width_ = uVar8;
  }
  return uVar7;
}

Assistant:

unsigned basic_printf_context<OutputIt, Char, AF>::parse_header(
  iterator &it, format_specs &spec) {
  unsigned arg_index = std::numeric_limits<unsigned>::max();
  char_type c = *it;
  if (c >= '0' && c <= '9') {
    // Parse an argument index (if followed by '$') or a width possibly
    // preceded with '0' flag(s).
    internal::error_handler eh;
    unsigned value = parse_nonnegative_int(it, eh);
    if (*it == '$') {  // value is an argument index
      ++it;
      arg_index = value;
    } else {
      if (c == '0')
        spec.fill_ = '0';
      if (value != 0) {
        // Nonzero value means that we parsed width and don't need to
        // parse it or flags again, so return now.
        spec.width_ = value;
        return arg_index;
      }
    }
  }
  parse_flags(spec, it);
  // Parse width.
  if (*it >= '0' && *it <= '9') {
    internal::error_handler eh;
    spec.width_ = parse_nonnegative_int(it, eh);
  } else if (*it == '*') {
    ++it;
    spec.width_ = visit_format_arg(
          internal::printf_width_handler<char_type>(spec), get_arg(it));
  }
  return arg_index;
}